

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsettings.cpp
# Opt level: O3

int32_t __thiscall icu_63::CollationSettings::hashCode(CollationSettings *this)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  uVar2 = this->options & 0xc;
  if (uVar2 != 0) {
    uVar2 = this->variableTop;
  }
  uVar1 = this->reorderCodesLength;
  uVar2 = this->options << 8 ^ uVar1 ^ uVar2;
  if (0 < (long)(int)uVar1) {
    lVar3 = 0;
    do {
      uVar2 = uVar2 ^ this->reorderCodes[lVar3] << ((byte)lVar3 & 0x1f);
      lVar3 = lVar3 + 1;
    } while ((int)uVar1 != lVar3);
  }
  return uVar2;
}

Assistant:

int32_t
CollationSettings::hashCode() const {
    int32_t h = options << 8;
    if((options & ALTERNATE_MASK) != 0) { h ^= variableTop; }
    h ^= reorderCodesLength;
    for(int32_t i = 0; i < reorderCodesLength; ++i) {
        h ^= (reorderCodes[i] << i);
    }
    return h;
}